

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

uint fmt::internal::parse_nonnegative_int<char>(char **s)

{
  byte bVar1;
  uint uVar2;
  FormatError *this;
  byte *pbVar3;
  
  pbVar3 = (byte *)*s;
  bVar1 = *pbVar3;
  if (9 < (byte)(bVar1 - 0x30)) {
    __assert_fail("\'0\' <= *s && *s <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/format.h"
                  ,0xeb0,
                  "unsigned int fmt::internal::parse_nonnegative_int(const Char *&) [Char = char]");
  }
  uVar2 = 0;
  do {
    pbVar3 = pbVar3 + 1;
    if (0xccccccc < uVar2) goto LAB_00122b15;
    uVar2 = ((uint)bVar1 + uVar2 * 10) - 0x30;
    *s = (char *)pbVar3;
    bVar1 = *pbVar3;
  } while ((byte)(bVar1 - 0x30) < 10);
  if (-1 < (int)uVar2) {
    return uVar2;
  }
LAB_00122b15:
  this = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this,(CStringRef)0x12b6d6);
  __cxa_throw(this,&FormatError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + (*s - '0');
    ++s;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}